

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O3

void __thiscall
gl4cts::DirectStateAccess::VertexArrays::EnableDisableAttributesTest::PrepareVAO
          (EnableDisableAttributesTest *this)

{
  undefined1 auVar1 [16];
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x708))(1,&this->m_vao);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glGenVertexArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x1df);
  (**(code **)(lVar4 + 0xd8))(this->m_vao);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x1e2);
  (**(code **)(lVar4 + 0x6c8))(1,&this->m_bo);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glGenBuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x1e6);
  (**(code **)(lVar4 + 0x40))(0x8892,this->m_bo);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glBindBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x1e9);
  iVar2 = this->m_max_attributes;
  lVar8 = (long)iVar2;
  uVar6 = 0xffffffffffffffff;
  if (-1 < lVar8) {
    uVar6 = lVar8 * 4;
  }
  pvVar5 = operator_new__(uVar6);
  auVar1 = _DAT_019ec5b0;
  if (0 < lVar8) {
    lVar9 = lVar8 + -1;
    auVar10._8_4_ = (int)lVar9;
    auVar10._0_8_ = lVar9;
    auVar10._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar6 = 0;
    auVar10 = auVar10 ^ _DAT_019ec5b0;
    auVar11 = _DAT_019f34d0;
    do {
      auVar12 = auVar11 ^ auVar1;
      if ((bool)(~(auVar12._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar12._0_4_ ||
                  auVar10._4_4_ < auVar12._4_4_) & 1)) {
        *(int *)((long)pvVar5 + uVar6 * 4) = (int)uVar6;
      }
      if ((auVar12._12_4_ != auVar10._12_4_ || auVar12._8_4_ <= auVar10._8_4_) &&
          auVar12._12_4_ <= auVar10._12_4_) {
        *(int *)((long)pvVar5 + uVar6 * 4 + 4) = (int)uVar6 + 1;
      }
      uVar6 = uVar6 + 2;
      lVar9 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar9 + 2;
    } while ((iVar2 + 1U & 0xfffffffe) != uVar6);
  }
  (**(code **)(lVar4 + 0x150))(0x8892,lVar8 * 4,pvVar5,0x88e4);
  operator_delete__(pvVar5);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glBufferData call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x1fb);
  uVar6 = (ulong)(uint)this->m_max_attributes;
  if (0 < this->m_max_attributes) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      (**(code **)(lVar4 + 0x1958))(uVar7 & 0xffffffff,1,0x1404,(int)uVar6 << 2,lVar8);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glVertexAttribIPointer call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                      ,0x203);
      uVar7 = uVar7 + 1;
      uVar6 = (ulong)this->m_max_attributes;
      lVar8 = lVar8 + 4;
    } while ((long)uVar7 < (long)uVar6);
  }
  return;
}

Assistant:

void EnableDisableAttributesTest::PrepareVAO()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* VAO creation. */
	gl.genVertexArrays(1, &m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays call failed.");

	gl.bindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	/* Buffer creation. */
	gl.genBuffers(1, &m_bo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers call failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	glw::GLint* reference_data = new glw::GLint[m_max_attributes];

	if (DE_NULL == reference_data)
	{
		throw 0;
	}

	for (glw::GLint i = 0; i < m_max_attributes; ++i)
	{
		reference_data[i] = i;
	}

	gl.bufferData(GL_ARRAY_BUFFER, sizeof(glw::GLint) * m_max_attributes, reference_data, GL_STATIC_DRAW);

	delete[] reference_data;

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");

	/* VAO setup. */
	for (glw::GLint i = 0; i < m_max_attributes; ++i)
	{
		gl.vertexAttribIPointer(i, 1, GL_INT, static_cast<glw::GLsizei>(sizeof(glw::GLint) * m_max_attributes),
								(glw::GLvoid*)((glw::GLint*)NULL + i));

		GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribIPointer call failed.");
	}
}